

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  unsigned_short local_2;
  
  if (c != 0) {
    ImVector<unsigned_short>::push_back(&this->InputQueueCharacters,&local_2);
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    if (c != 0)
        InputQueueCharacters.push_back(c <= IM_UNICODE_CODEPOINT_MAX ? (ImWchar)c : IM_UNICODE_CODEPOINT_INVALID);
}